

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O1

void __thiscall om::net::mac_addr::mac_addr(mac_addr *this,string *str_)

{
  uint i;
  int iVar1;
  long lVar2;
  invalid_argument *this_00;
  int temp [6];
  
  this->_addr[4] = '\0';
  this->_addr[5] = '\0';
  this->_addr[0] = '\0';
  this->_addr[1] = '\0';
  this->_addr[2] = '\0';
  this->_addr[3] = '\0';
  temp[0] = 0;
  temp[1] = 0;
  temp[2] = 0;
  temp[3] = 0;
  temp[4] = 0;
  temp[5] = 0;
  iVar1 = __isoc99_sscanf((str_->_M_dataplus)._M_p,"%x:%x:%x:%x:%x:%x",temp,temp + 1,temp + 2,
                          temp + 3,temp + 4,temp + 5);
  if (iVar1 == 6) {
    lVar2 = 0;
    do {
      this->_addr[lVar2] = (uint8_t)temp[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"mac_addr: invalid address format");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

explicit mac_addr(const std::string& str_)
			{
				int temp[6] = {0};


				if (std::sscanf(str_.c_str(), "%x:%x:%x:%x:%x:%x",
								&temp[0], &temp[1], &temp[2], &temp[3], &temp[4], &temp[5]) != 6)
					throw std::invalid_argument("mac_addr: invalid address format");

				for (unsigned i = 0; i < 6; i++)
					_addr[i] = (uint8_t) temp[i];
			}